

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-elastic-local-frame-dynamical-system.cpp
# Opt level: O1

void __thiscall
stateObservation::flexibilityEstimation::IMUElasticLocalFrameDynamicalSystem::
computeElastPendulumForcesAndMoments1
          (IMUElasticLocalFrameDynamicalSystem *this,IndexedMatrixArray *PrArray,Vector3 *position,
          Vector3 *linVelocity,Vector3 *oriVector,Matrix3 *orientation,Vector3 *angVel,
          Vector *forces,Vector *moments)

{
  iterator *this_00;
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  _Map_pointer ppMVar5;
  undefined1 (*pauVar6) [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  long lVar12;
  DenseStorage<double,__1,__1,__1,_0> *pDVar13;
  char *pcVar14;
  uint uVar15;
  ulong uVar16;
  undefined4 uVar17;
  double dVar18;
  Vector3 du;
  SrcEvaluatorType srcEvaluator;
  add_assign_op<double,_double> local_129;
  undefined1 local_128 [16];
  undefined1 local_118 [24];
  ulong local_100;
  undefined1 local_f8 [56];
  double local_c0;
  undefined1 *local_b8;
  undefined1 local_b0 [16];
  Matrix<double,_3,_1,_0,_3,_1> local_98;
  Vector3 *local_80;
  Vector3 *local_78;
  Vector3 *local_70;
  double local_68;
  DenseStorage<double,__1,__1,__1,_0> local_60;
  Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>
  local_48;
  
  lVar12 = (forces->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
  ;
  local_78 = linVelocity;
  local_70 = position;
  if (-1 < lVar12) {
    local_100 = (ulong)this->nbContacts_;
    if (lVar12 != 0) {
      memset((forces->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data,0,lVar12 << 3);
    }
    lVar12 = (moments->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
    if (-1 < lVar12) {
      local_80 = oriVector;
      if (lVar12 != 0) {
        memset((moments->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data,0,lVar12 << 3);
      }
      if (local_100 != 0) {
        this_00 = &(PrArray->v_).
                   super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start;
        uVar16 = 0;
        do {
          ppMVar5 = (PrArray->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node;
          lVar12 = ((long)(PrArray->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_last -
                    (long)(PrArray->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) *
                   -0x5555555555555555 +
                   ((long)(PrArray->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                    (long)(PrArray->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) *
                   -0x5555555555555555 +
                   (((long)ppMVar5 -
                     (long)(PrArray->v_).
                           super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
                   (ulong)(ppMVar5 == (_Map_pointer)0x0)) * 0x15;
          if (lVar12 == 0) {
LAB_00155f2c:
            __assert_fail("checkIndex(time) && \"Error: Time out of range\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/tools/definitions.hxx"
                          ,0x9b,
                          "void stateObservation::IndexedMatrixArray::check_(unsigned int) const");
          }
          uVar4 = PrArray->k_;
          uVar15 = (uint)uVar16;
          if ((uVar15 < uVar4) || (lVar12 + (ulong)uVar4 <= uVar16)) goto LAB_00155f2c;
          local_118._0_16_ =
               *(undefined1 (*) [16])
                (local_70->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                m_data.array;
          local_128._8_8_ = 0;
          local_128._0_8_ =
               (local_70->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[2];
          pDVar13 = (DenseStorage<double,__1,__1,__1,_0> *)
                    std::
                    _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
                    ::operator[](this_00,(ulong)(uVar15 - uVar4));
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
                    ((DenseStorage<double,__1,__1,__1,_0> *)local_f8,pDVar13);
          if ((double)local_f8._8_8_ != 1.48219693752374e-323) {
            pcVar14 = 
            "Eigen::Product<Eigen::Matrix<double, 3, 3>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, 3, 3>, Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
            ;
LAB_00155feb:
            __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                          ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar14);
          }
          if (CONCAT44(local_f8._20_4_,local_f8._16_4_) != 1) {
            pcVar14 = 
            "static void Eigen::internal::Assignment<Eigen::Matrix<double, 3, 1>, Eigen::Product<Eigen::Matrix<double, 3, 3>, Eigen::Matrix<double, -1, -1>>, Eigen::internal::add_assign_op<double, double>>::run(DstXprType &, const SrcXprType &, const internal::add_assign_op<Scalar, Scalar> &) [DstXprType = Eigen::Matrix<double, 3, 1>, SrcXprType = Eigen::Product<Eigen::Matrix<double, 3, 3>, Eigen::Matrix<double, -1, -1>>, Functor = Eigen::internal::add_assign_op<double, double>, Kind = Eigen::internal::Dense2Dense, EnableIf = void]"
            ;
LAB_00155fcc:
            __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                          "/usr/include/eigen3/Eigen/src/Core/ProductEvaluators.h",0xa1,pcVar14);
          }
          dVar1 = *(double *)local_f8._0_8_;
          dVar2 = *(double *)(local_f8._0_8_ + 8);
          dVar3 = *(double *)(local_f8._0_8_ + 0x10);
          dVar11 = (double)local_118._8_8_ +
                   dVar3 * (orientation->
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                           m_data.array[7] +
                   dVar2 * (orientation->
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                           m_data.array[4] +
                   (orientation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                   m_storage.m_data.array[1] * dVar1;
          local_118._8_4_ = SUB84(dVar11,0);
          local_118._0_8_ =
               (double)local_118._0_8_ +
               dVar3 * (orientation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data.array[6] +
               dVar2 * (orientation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data.array[3] +
               (orientation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
               .m_data.array[0] * dVar1;
          local_118._12_4_ = (int)((ulong)dVar11 >> 0x20);
          uVar17 = local_128._12_4_;
          local_128._8_4_ = local_128._8_4_;
          local_128._0_8_ =
               local_128._0_8_ +
               dVar3 * (orientation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data.array[8] +
               dVar2 * (orientation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data.array[5] +
               dVar1 * (orientation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data.array[2];
          local_128._12_4_ = uVar17;
          free((void *)local_f8._0_8_);
          dVar1 = (double)local_118._8_8_ -
                  (this->pe).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[1];
          local_118._8_4_ = SUB84(dVar1,0);
          local_118._0_8_ =
               (double)local_118._0_8_ -
               (this->pe).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0];
          local_118._12_4_ = (int)((ulong)dVar1 >> 0x20);
          uVar17 = local_128._12_4_;
          local_128._8_4_ = local_128._8_4_;
          local_128._0_8_ =
               local_128._0_8_ -
               (this->pe).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2];
          local_128._12_4_ = uVar17;
          local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0] = (local_78->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                     m_storage.m_data.array[0];
          local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1] = (local_78->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                     m_storage.m_data.array[1];
          local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[2] = (local_78->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                     m_storage.m_data.array[2];
          local_f8._8_8_ =
               (angVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[2];
          local_f8._40_16_ =
               *(undefined1 (*) [16])
                (angVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                m_data.array;
          local_f8._16_4_ =
               *(undefined4 *)
                ((angVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                 m_data.array + 1);
          local_f8._24_4_ =
               *(undefined4 *)
                ((angVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                 m_data.array + 2);
          local_f8._0_8_ = (double *)0x0;
          local_f8._20_4_ =
               *(uint *)((long)(angVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                               ).m_storage.m_data.array + 0xc) ^ 0x80000000;
          local_f8._28_4_ =
               *(uint *)((long)(angVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                               ).m_storage.m_data.array + 0x14) ^ 0x80000000;
          local_f8._32_8_ = (undefined1 *)0x0;
          local_c0 = -(angVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                      m_storage.m_data.array[0];
          local_b8 = (undefined1 *)0x0;
          ppMVar5 = (PrArray->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node;
          lVar12 = ((long)(PrArray->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_last -
                    (long)(PrArray->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) *
                   -0x5555555555555555 +
                   ((long)(PrArray->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                    (long)(PrArray->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) *
                   -0x5555555555555555 +
                   (((long)ppMVar5 -
                     (long)(PrArray->v_).
                           super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
                   (ulong)(ppMVar5 == (_Map_pointer)0x0)) * 0x15;
          if (lVar12 == 0) goto LAB_00155f2c;
          uVar4 = PrArray->k_;
          if ((uVar15 < uVar4) || (lVar12 + (ulong)uVar4 <= uVar16)) goto LAB_00155f2c;
          pDVar13 = (DenseStorage<double,__1,__1,__1,_0> *)
                    std::
                    _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
                    ::operator[](this_00,(ulong)(uVar15 - uVar4));
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_60,pDVar13);
          if (local_60.m_rows != 3) {
            pcVar14 = 
            "Eigen::Product<Eigen::Product<Eigen::Matrix<double, 3, 3>, Eigen::Matrix<double, 3, 3>>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Product<Eigen::Matrix<double, 3, 3>, Eigen::Matrix<double, 3, 3>>, Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
            ;
            goto LAB_00155feb;
          }
          if (local_60.m_cols != 1) {
            pcVar14 = 
            "static void Eigen::internal::Assignment<Eigen::Matrix<double, 3, 1>, Eigen::Product<Eigen::Product<Eigen::Matrix<double, 3, 3>, Eigen::Matrix<double, 3, 3>>, Eigen::Matrix<double, -1, -1>>, Eigen::internal::add_assign_op<double, double>>::run(DstXprType &, const SrcXprType &, const internal::add_assign_op<Scalar, Scalar> &) [DstXprType = Eigen::Matrix<double, 3, 1>, SrcXprType = Eigen::Product<Eigen::Product<Eigen::Matrix<double, 3, 3>, Eigen::Matrix<double, 3, 3>>, Eigen::Matrix<double, -1, -1>>, Functor = Eigen::internal::add_assign_op<double, double>, Kind = Eigen::internal::Dense2Dense, EnableIf = void]"
            ;
            goto LAB_00155fcc;
          }
          local_48.m_lhs.m_lhs = (LhsNested)local_f8;
          local_48.m_rhs = (RhsNested)&local_60;
          local_48.m_lhs.m_rhs = orientation;
          Eigen::internal::
          call_dense_assignment_loop<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,_1,_1,0,_1,_1>,1>,Eigen::internal::add_assign_op<double,double>>
                    (&local_98,&local_48,&local_129);
          free(local_60.m_data);
          ppMVar5 = (PrArray->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node;
          lVar12 = ((long)(PrArray->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_last -
                    (long)(PrArray->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) *
                   -0x5555555555555555 +
                   ((long)(PrArray->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                    (long)(PrArray->v_).
                          super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) *
                   -0x5555555555555555 +
                   (((long)ppMVar5 -
                     (long)(PrArray->v_).
                           super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
                   (ulong)(ppMVar5 == (_Map_pointer)0x0)) * 0x15;
          if (lVar12 == 0) goto LAB_00155f2c;
          uVar4 = PrArray->k_;
          if ((uVar15 < uVar4) || (lVar12 + (ulong)uVar4 <= uVar16)) goto LAB_00155f2c;
          pDVar13 = (DenseStorage<double,__1,__1,__1,_0> *)
                    std::
                    _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
                    ::operator[](this_00,(ulong)(uVar15 - uVar4));
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
                    ((DenseStorage<double,__1,__1,__1,_0> *)local_f8,pDVar13);
          if (((double)local_f8._8_8_ != 1.48219693752374e-323) ||
             (CONCAT44(local_f8._20_4_,local_f8._16_4_) != 1)) {
            __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                          "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::Matrix<double, 3, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::Matrix<double, 3, 1>]"
                         );
          }
          dVar1 = *(double *)local_f8._0_8_ -
                  (this->pe).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[0];
          dVar3 = *(double *)(local_f8._0_8_ + 8) -
                  (this->pe).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[1];
          dVar2 = *(double *)(local_f8._0_8_ + 0x10) -
                  (this->pe).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[2];
          local_68 = dVar2 * dVar2 + dVar3 * dVar3 + dVar1 * dVar1;
          free((void *)local_f8._0_8_);
          local_f8._8_8_ =
               SQRT((double)local_128._0_8_ * (double)local_128._0_8_ +
                    (double)local_118._8_8_ * (double)local_118._8_8_ +
                    (double)local_118._0_8_ * (double)local_118._0_8_);
          local_f8._8_8_ = -((double)local_f8._8_8_ - SQRT(local_68)) / (double)local_f8._8_8_;
          local_f8._32_8_ = local_f8 + 0x28;
          dVar1 = (double)local_128._0_8_ *
                  (this->KfeRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array[6] +
                  (this->KfeRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array[3] * (double)local_118._8_8_ +
                  (this->KfeRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array[0] * (double)local_118._0_8_;
          dVar2 = (double)local_128._0_8_ *
                  (this->KfeRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array[7] +
                  (this->KfeRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array[4] * (double)local_118._8_8_ +
                  (this->KfeRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array[1] * (double)local_118._0_8_;
          local_f8._48_4_ = SUB84(dVar2,0);
          local_f8._40_8_ = dVar1;
          local_f8._52_4_ = (int)((ulong)dVar2 >> 0x20);
          local_c0 = (this->KfeRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[8] * (double)local_128._0_8_ +
                     (this->KfeRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[5] * (double)local_118._8_8_ +
                     (this->KfeRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[2] * (double)local_118._0_8_;
          local_b8 = local_b0;
          dVar3 = local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[2] *
                  (this->KfvRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array[6] +
                  local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[1] *
                  (this->KfvRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array[3] +
                  (this->KfvRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array[0] *
                  local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[0];
          dVar11 = local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[2] *
                   (this->KfvRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[7] +
                   local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[1] *
                   (this->KfvRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[4] +
                   (this->KfvRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[1] *
                   local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[0];
          local_b0._8_4_ = SUB84(dVar11,0);
          local_b0._0_8_ = dVar3;
          local_b0._12_4_ = (int)((ulong)dVar11 >> 0x20);
          if ((forces->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows < 3) goto LAB_00155f4b;
          dVar18 = (local_c0 +
                   local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[2] *
                   (this->KfvRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[8] +
                   local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[1] *
                   (this->KfvRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[5] +
                   local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[0] *
                   (this->KfvRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[2]) * (double)local_f8._8_8_;
          dVar1 = (dVar1 + dVar3) * (double)local_f8._8_8_;
          dVar2 = (dVar2 + dVar11) * (double)local_f8._8_8_;
          pauVar6 = (undefined1 (*) [16])
                    (forces->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_data;
          dVar3 = *(double *)(*pauVar6 + 8) + dVar2;
          auVar10._8_4_ = SUB84(dVar3,0);
          auVar10._0_8_ = *(double *)*pauVar6 + dVar1;
          auVar10._12_4_ = (int)((ulong)dVar3 >> 0x20);
          *pauVar6 = auVar10;
          *(double *)pauVar6[1] = *(double *)pauVar6[1] + dVar18;
          if ((moments->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows < 3) goto LAB_00155f4b;
          pauVar6 = (undefined1 (*) [16])
                    (moments->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_data;
          dVar3 = *(double *)(*pauVar6 + 8) +
                  dVar18 * -(double)local_118._0_8_ + dVar2 * 0.0 + dVar1 * (double)local_128._0_8_;
          auVar7._8_4_ = SUB84(dVar3,0);
          auVar7._0_8_ = *(double *)*pauVar6 +
                         dVar18 * (double)local_118._8_8_ +
                         dVar2 * -(double)local_128._0_8_ + dVar1 * 0.0;
          auVar7._12_4_ = (int)((ulong)dVar3 >> 0x20);
          *pauVar6 = auVar7;
          *(double *)pauVar6[1] =
               ((dVar18 * 0.0 + (double)local_118._0_8_ * dVar2) - (double)local_118._8_8_ * dVar1)
               + *(double *)pauVar6[1];
          uVar16 = uVar16 + 1;
        } while ((int)local_100 != (int)uVar16);
      }
      if (2 < (moments->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows) {
        pauVar6 = (undefined1 (*) [16])
                  (moments->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                  m_storage.m_data;
        dVar3 = (local_80->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                m_data.array[0];
        dVar11 = (local_80->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                 m_data.array[1];
        dVar1 = (local_80->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                m_data.array[2];
        dVar2 = *(double *)(*pauVar6 + 8) +
                ((dVar3 * -(this->KteRopes_).
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                           m_data.array[1] -
                 dVar11 * (this->KteRopes_).
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                          m_data.array[4]) -
                dVar1 * (this->KteRopes_).
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                        m_data.array[7]);
        auVar8._8_4_ = SUB84(dVar2,0);
        auVar8._0_8_ = *(double *)*pauVar6 +
                       ((dVar3 * -(this->KteRopes_).
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                  m_storage.m_data.array[0] -
                        dVar11 * (this->KteRopes_).
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                 m_storage.m_data.array[3]) -
                       dVar1 * (this->KteRopes_).
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                               m_storage.m_data.array[6]);
        auVar8._12_4_ = (int)((ulong)dVar2 >> 0x20);
        *pauVar6 = auVar8;
        *(double *)pauVar6[1] =
             ((-(this->KteRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                m_storage.m_data.array[8] *
               (local_80->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[2] -
              (this->KteRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
              m_storage.m_data.array[5] *
              (local_80->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[1]) -
             (this->KteRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[2] *
             (local_80->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
             m_data.array[0]) + *(double *)pauVar6[1];
        if (2 < (moments->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows) {
          pauVar6 = (undefined1 (*) [16])
                    (moments->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_data;
          dVar3 = (angVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                  m_data.array[0];
          dVar11 = (angVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                   m_data.array[1];
          dVar1 = (angVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                  m_data.array[2];
          dVar2 = *(double *)(*pauVar6 + 8) +
                  ((dVar3 * -(this->KtvRopes_).
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                             m_data.array[1] -
                   dVar11 * (this->KtvRopes_).
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                            m_data.array[4]) -
                  dVar1 * (this->KtvRopes_).
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                          m_data.array[7]);
          auVar9._8_4_ = SUB84(dVar2,0);
          auVar9._0_8_ = *(double *)*pauVar6 +
                         ((dVar3 * -(this->KtvRopes_).
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                    m_storage.m_data.array[0] -
                          dVar11 * (this->KtvRopes_).
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                   m_storage.m_data.array[3]) -
                         dVar1 * (this->KtvRopes_).
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                 m_storage.m_data.array[6]);
          auVar9._12_4_ = (int)((ulong)dVar2 >> 0x20);
          *pauVar6 = auVar9;
          *(double *)pauVar6[1] =
               ((-(this->KtvRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                  m_storage.m_data.array[8] *
                 (angVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                 m_data.array[2] -
                (this->KtvRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                m_storage.m_data.array[5] *
                (angVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                m_data.array[1]) -
               (this->KtvRopes_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array[2] *
               (angVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[0]) + *(double *)pauVar6[1];
          if (this->printed_ == false) {
            this->printed_ = true;
          }
          return;
        }
      }
LAB_00155f4b:
      __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                    ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                    "Eigen::Block<Eigen::Matrix<double, -1, 1>, 3, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = 3, BlockCols = 1, InnerPanel = false]"
                   );
    }
  }
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

void IMUElasticLocalFrameDynamicalSystem::computeElastPendulumForcesAndMoments1
                              (const IndexedMatrixArray& PrArray,
                               const Vector3& position, const Vector3& linVelocity,
                               const Vector3& oriVector, const Matrix3& orientation,
                               const Vector3& angVel,
                               Vector& forces, Vector& moments)
    {
        unsigned nbContacts(getContactsNumber());
        forces.setZero(); moments.setZero();

        stateObservation::Vector3 forcei;
        stateObservation::Vector3 momenti;
        stateObservation::Vector3 u, du;

        double ropeLength;
        double modifiedRopeLength;
        double lengthRate;

        for (unsigned i = 0; i<nbContacts ; ++i)
        {
            u = position;
            u.noalias() += orientation*PrArray[i] ;
            u.noalias() -= pe;

            du = linVelocity;
            du.noalias() += kine::skewSymmetric(angVel)*orientation*PrArray[i] ;

            ropeLength=(PrArray[i]-pe).norm();
            modifiedRopeLength=u.norm();

            lengthRate=(modifiedRopeLength-ropeLength)/modifiedRopeLength;

            forcei = -lengthRate*(KfeRopes_*u+KfvRopes_*du);
            forces.segment<3>(0) += forcei;

            momenti.noalias() = kine::skewSymmetric(u)*forcei;
            moments.segment<3>(0) += momenti;
        }

        moments.segment<3>(0).noalias() += - KteRopes_*oriVector;
        moments.segment<3>(0).noalias() += - KtvRopes_*angVel;

        if(printed_==false)
        {
    //            std::cout << "ropeLength=" << ropeLength << std::endl;
    //        std::cout << "modifiedRopeLength=" << modifiedRopeLength << std::endl;
    //            std::cout << "contactOriUnitVector=" << contactOriUnitVector.transpose() << std::endl;
    //            std::cout << "forcei=" << forcei.transpose() << std::endl;
    //            std::cout << "momenti=" << momenti.transpose() << std::endl;
            printed_=true;
        }

    }